

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

void PairSearchHelper(ON_RTreeNode *a_nodeA,ON_RTreeNode *a_nodeB,ON_RTreePairSearchResult *a_result
                     )

{
  int iVar1;
  bool bVar2;
  ON_RTreeBranch *pOVar3;
  ON_2dex *pOVar4;
  ON_2dex *r;
  ON_RTreeBranch *branchBmax;
  ON_RTreeBranch *branchB;
  ON_RTreeBranch *branchAmax;
  ON_RTreeBranch *branchA;
  ON_RTreePairSearchResult *a_result_local;
  ON_RTreeNode *a_nodeB_local;
  ON_RTreeNode *a_nodeA_local;
  
  branchAmax = a_nodeA->m_branch;
  pOVar3 = branchAmax + a_nodeA->m_count;
  iVar1 = a_nodeB->m_count;
  for (; branchAmax < pOVar3; branchAmax = branchAmax + 1) {
    for (branchBmax = a_nodeB->m_branch; branchBmax < a_nodeB->m_branch + iVar1;
        branchBmax = branchBmax + 1) {
      bVar2 = PairSearchOverlapHelper(&branchAmax->m_rect,&branchBmax->m_rect,a_result->m_tolerance)
      ;
      if (bVar2) {
        if (a_nodeA->m_level < 1) {
          if (a_nodeB->m_level < 1) {
            pOVar4 = ON_SimpleArray<ON_2dex>::AppendNew(a_result->m_result);
            pOVar4->i = (int)(branchAmax->field_1).m_id;
            pOVar4->j = (int)(branchBmax->field_1).m_id;
          }
          else {
            PairSearchHelper(branchAmax,(branchBmax->field_1).m_child,a_result);
          }
        }
        else if (a_nodeB->m_level < 1) {
          PairSearchHelper((branchAmax->field_1).m_child,branchBmax,a_result);
        }
        else {
          PairSearchHelper((branchAmax->field_1).m_child,(branchBmax->field_1).m_child,a_result);
        }
      }
    }
  }
  return;
}

Assistant:

static void PairSearchHelper( const ON_RTreeNode* a_nodeA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchResult* a_result )
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax, *branchB, *branchBmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;
  branchBmax = a_nodeB->m_branch + a_nodeB->m_count;
  while(branchA < branchAmax)
  {
    for ( branchB = a_nodeB->m_branch; branchB < branchBmax; branchB++ )
    {
      if ( PairSearchOverlapHelper( &branchA->m_rect, &branchB->m_rect, a_result->m_tolerance ) )
      {
        if ( a_nodeA->m_level > 0 )
        {
          if ( a_nodeB->m_level > 0 )
            PairSearchHelper(branchA->m_child,branchB->m_child,a_result);
          else
            PairSearchHelper(branchA->m_child,branchB,a_result);
        }
        else if ( a_nodeB->m_level > 0 )
        {
          PairSearchHelper(branchA,branchB->m_child,a_result);
        }
        else
        {
          ON_2dex& r = a_result->m_result->AppendNew();
          r.i = (int)branchA->m_id;
          r.j = (int)branchB->m_id;
        }
      }
    }
    branchA++;
  }
}